

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QString,QtInstallDirectoryWithTriple>::
emplaceValue<QtInstallDirectoryWithTriple_const&>
          (Node<QString,QtInstallDirectoryWithTriple> *this,QtInstallDirectoryWithTriple *args)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  Data *pDVar4;
  QArrayData *pQVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_FS_OFFSET;
  QHash<QString,_QString> moved;
  QHash<QString,_QString> local_60;
  QArrayData *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  QHash<QString,_QString> local_40;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  Node<QString,QtInstallDirectoryWithTriple> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (args->qtInstallDirectory).d.d;
  pcVar2 = (args->qtInstallDirectory).d.ptr;
  qVar3 = (args->qtInstallDirectory).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar4 = (args->qtDirectories).d;
  if ((pDVar4 != (Data *)0x0) && ((pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)
     ) {
    LOCK();
    (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i =
         (pDVar4->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = &((args->triple).d.d)->super_QArrayData;
  pcStack_30 = (args->triple).d.ptr;
  local_28 = (args->triple).d.size;
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (((Data *)local_38)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_38)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_20 = (Node<QString,QtInstallDirectoryWithTriple>)args->enabled;
  local_58 = *(QArrayData **)(this + 0x18);
  uStack_50 = *(undefined8 *)(this + 0x20);
  *(Data **)(this + 0x18) = pDVar1;
  *(char16_t **)(this + 0x20) = pcVar2;
  local_48 = *(undefined8 *)(this + 0x28);
  *(qsizetype *)(this + 0x28) = qVar3;
  local_40.d = (Data *)0x0;
  local_60.d = *(Data **)(this + 0x30);
  *(Data **)(this + 0x30) = pDVar4;
  QHash<QString,_QString>::~QHash(&local_60);
  pQVar5 = *(QArrayData **)(this + 0x38);
  uVar6 = *(undefined8 *)(this + 0x40);
  *(QArrayData **)(this + 0x38) = local_38;
  *(char16_t **)(this + 0x40) = pcStack_30;
  uVar7 = *(undefined8 *)(this + 0x48);
  *(qsizetype *)(this + 0x48) = local_28;
  this[0x50] = local_20;
  local_38 = pQVar5;
  pcStack_30 = (char16_t *)uVar6;
  local_28 = uVar7;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_40);
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }